

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O3

void Abc_ObjSortByDelay(Abc_IffMan_t *p,Abc_Obj_t *pObj,int fDelay1,Abc_Obj_t **ppNodes)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  Abc_Obj_t *t;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  lVar4 = (long)(pObj->vFanins).nSize;
  if (0 < lVar4) {
    uVar5 = 1;
    lVar6 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
      ppNodes[lVar6] = pAVar3;
      uVar7 = *(uint *)&pAVar3->field_0x14 & 0xf;
      if (((uVar7 != 2) && (uVar7 != 5)) && (uVar7 = uVar5, lVar6 != 0)) {
        do {
          uVar8 = uVar7 - 2;
          pAVar3 = ppNodes[uVar8];
          iVar1 = pAVar3->Id;
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_002d57d9:
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIfif.c"
                          ,0x33,"Abc_IffObj_t *Abc_IffObj(Abc_IffMan_t *, int)");
          }
          uVar7 = uVar7 - 1;
          uVar2 = ppNodes[uVar7]->Id;
          if (((long)(int)uVar2 < 0) || ((uint)p->nObjs <= uVar2)) goto LAB_002d57d9;
          if (p->pObjs[iVar1].Delay[fDelay1] + p->pPars->pLutDelays[uVar8] <
              p->pObjs[(int)uVar2].Delay[fDelay1] + p->pPars->pLutDelays[uVar7]) {
            ppNodes[uVar8] = ppNodes[uVar7];
            ppNodes[uVar7] = pAVar3;
          }
        } while (1 < (int)uVar7);
      }
      lVar6 = lVar6 + 1;
      uVar5 = uVar5 + 1;
    } while (lVar6 != lVar4);
  }
  return;
}

Assistant:

void Abc_ObjSortByDelay( Abc_IffMan_t * p, Abc_Obj_t * pObj, int fDelay1, Abc_Obj_t ** ppNodes )
{
    Abc_Obj_t * pFanin;
    int i, a, k = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        ppNodes[k++] = pFanin;
        if ( Abc_ObjIsCi(pFanin) )
            continue;
        for ( a = k-1; a > 0; a-- )
            if ( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] < Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] )
                ABC_SWAP( Abc_Obj_t *, ppNodes[a-1], ppNodes[a] );
    }
/*
    for ( a = 1; a < k; a++ )
    {
        float D1 = Abc_IffDelay(p, ppNodes[a-1], fDelay1);
        float D2 = Abc_IffDelay(p, ppNodes[a], fDelay1);
        if ( Abc_ObjIsCi(ppNodes[a-1]) || Abc_ObjIsCi(ppNodes[a]) )
            continue;
        assert( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] >= Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] - 0.01 );
    }
*/
}